

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

bool embree::sse42::
     BVHNIntersectorKHybrid<4,_4,_1,_true,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::QuadMvIntersectorKPluecker<4,_4,_true>_>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray
                ,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  undefined8 *puVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  undefined4 uVar9;
  Scene *pSVar10;
  Geometry *pGVar11;
  RTCFilterFunctionN p_Var12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  int iVar27;
  uint uVar28;
  RTCRayN *pRVar29;
  ulong uVar30;
  ulong uVar31;
  ulong uVar32;
  ulong uVar33;
  ulong uVar34;
  long lVar35;
  NodeRef *pNVar36;
  NodeRef *pNVar37;
  ulong uVar38;
  ulong uVar39;
  undefined4 uVar40;
  ulong unaff_R12;
  size_t mask;
  ulong uVar41;
  ulong uVar42;
  ulong uVar43;
  bool bVar44;
  bool bVar45;
  float fVar46;
  float fVar47;
  float fVar61;
  float fVar63;
  undefined1 auVar48 [16];
  float fVar62;
  float fVar64;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  float fVar65;
  float fVar79;
  float fVar80;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  float fVar81;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  float fVar82;
  float fVar91;
  float fVar92;
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  float fVar93;
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  float fVar94;
  float fVar100;
  float fVar101;
  undefined1 auVar95 [16];
  float fVar102;
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  float fVar103;
  float fVar106;
  float fVar107;
  undefined1 auVar104 [16];
  float fVar108;
  undefined1 auVar105 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  float fVar111;
  float fVar112;
  float fVar113;
  float fVar114;
  float fVar115;
  float fVar116;
  float fVar117;
  float fVar118;
  float fVar119;
  float fVar120;
  float fVar123;
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  float fVar124;
  float fVar125;
  float fVar128;
  float fVar129;
  float fVar130;
  float fVar131;
  float fVar132;
  float fVar133;
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  float fVar134;
  float fVar135;
  float fVar136;
  float fVar137;
  float fVar138;
  float fVar139;
  float fVar140;
  float fVar141;
  float fVar142;
  float fVar143;
  float fVar144;
  float fVar145;
  float fVar146;
  float fVar147;
  float fVar148;
  float fVar149;
  float fVar150;
  float fVar151;
  float fVar152;
  float fVar153;
  float fVar154;
  float fVar155;
  float fVar158;
  float fVar159;
  float fVar160;
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  float fVar161;
  float fVar162;
  float fVar164;
  float fVar165;
  float fVar166;
  float fVar167;
  float fVar168;
  undefined1 auVar163 [16];
  undefined1 local_ab8 [16];
  ulong local_aa0;
  ulong local_a98;
  ulong local_a90;
  long local_a88;
  float fStack_a80;
  float fStack_a7c;
  float local_a78;
  float fStack_a74;
  float fStack_a70;
  float fStack_a6c;
  float local_a68;
  float fStack_a64;
  float fStack_a60;
  float fStack_a5c;
  undefined1 (*local_a50) [16];
  RTCFilterFunctionNArguments args;
  undefined8 local_978;
  undefined8 uStack_970;
  float local_968;
  float fStack_964;
  float fStack_960;
  float fStack_95c;
  float local_958;
  float fStack_954;
  float fStack_950;
  float fStack_94c;
  undefined1 local_948 [16];
  undefined1 local_938 [16];
  undefined1 local_928 [16];
  undefined1 local_918 [16];
  undefined1 local_908 [16];
  undefined1 local_8f8 [16];
  undefined1 local_8e8 [16];
  undefined1 local_8d8 [8];
  float fStack_8d0;
  float fStack_8cc;
  undefined1 local_8c8 [16];
  undefined1 local_8b8 [16];
  undefined1 local_8a8 [16];
  undefined1 local_898 [16];
  undefined4 local_888;
  undefined4 uStack_884;
  undefined4 uStack_880;
  undefined4 uStack_87c;
  undefined1 local_878 [16];
  undefined4 local_868;
  undefined4 uStack_864;
  undefined4 uStack_860;
  undefined4 uStack_85c;
  undefined4 local_858;
  undefined4 uStack_854;
  undefined4 uStack_850;
  undefined4 uStack_84c;
  undefined1 local_848 [16];
  undefined4 local_838;
  undefined4 uStack_834;
  undefined4 uStack_830;
  undefined4 uStack_82c;
  uint local_828;
  uint uStack_824;
  uint uStack_820;
  uint uStack_81c;
  uint local_818;
  uint uStack_814;
  uint uStack_810;
  uint uStack_80c;
  uint local_808;
  uint uStack_804;
  uint uStack_800;
  uint uStack_7fc;
  undefined1 local_7f8 [16];
  undefined8 local_7e8;
  undefined8 uStack_7e0;
  NodeRef stack [244];
  
  stack[0] = root;
  fVar6 = *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar7 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  fVar8 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  fVar134 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar139 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar144 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fVar154 = fVar134 * 0.99999964;
  fVar161 = fVar139 * 0.99999964;
  fVar149 = fVar144 * 0.99999964;
  fVar134 = fVar134 * 1.0000004;
  fVar139 = fVar139 * 1.0000004;
  fVar144 = fVar144 * 1.0000004;
  uVar38 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar39 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar34 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar42 = uVar38 ^ 0x10;
  uVar41 = uVar39 ^ 0x10;
  uVar33 = uVar34 ^ 0x10;
  iVar27 = (tray->tnear).field_0.i[k];
  auVar95._4_4_ = iVar27;
  auVar95._0_4_ = iVar27;
  auVar95._8_4_ = iVar27;
  auVar95._12_4_ = iVar27;
  iVar27 = (tray->tfar).field_0.i[k];
  auVar104._4_4_ = iVar27;
  auVar104._0_4_ = iVar27;
  auVar104._8_4_ = iVar27;
  auVar104._12_4_ = iVar27;
  local_7e8 = mm_lookupmask_ps._0_8_;
  uStack_7e0 = mm_lookupmask_ps._8_8_;
  local_7f8 = mm_lookupmask_ps._240_16_;
  local_a50 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  pNVar37 = stack + 1;
  local_aa0 = uVar33;
  local_a98 = uVar41;
  local_a90 = uVar42;
LAB_0028e1e1:
  pNVar36 = pNVar37;
  if (pNVar36 != stack) {
    pNVar37 = pNVar36 + -1;
    uVar32 = pNVar36[-1].ptr;
    do {
      if ((uVar32 & 8) == 0) {
        pfVar1 = (float *)(uVar32 + 0x20 + uVar38);
        auVar48._0_4_ = (*pfVar1 - fVar6) * fVar154;
        auVar48._4_4_ = (pfVar1[1] - fVar6) * fVar154;
        auVar48._8_4_ = (pfVar1[2] - fVar6) * fVar154;
        auVar48._12_4_ = (pfVar1[3] - fVar6) * fVar154;
        pfVar1 = (float *)(uVar32 + 0x20 + uVar39);
        auVar85._0_4_ = (*pfVar1 - fVar7) * fVar161;
        auVar85._4_4_ = (pfVar1[1] - fVar7) * fVar161;
        auVar85._8_4_ = (pfVar1[2] - fVar7) * fVar161;
        auVar85._12_4_ = (pfVar1[3] - fVar7) * fVar161;
        auVar48 = maxps(auVar48,auVar85);
        pfVar1 = (float *)(uVar32 + 0x20 + uVar34);
        auVar66._0_4_ = (*pfVar1 - fVar8) * fVar149;
        auVar66._4_4_ = (pfVar1[1] - fVar8) * fVar149;
        auVar66._8_4_ = (pfVar1[2] - fVar8) * fVar149;
        auVar66._12_4_ = (pfVar1[3] - fVar8) * fVar149;
        auVar67 = maxps(auVar66,auVar95);
        auVar48 = maxps(auVar48,auVar67);
        pfVar1 = (float *)(uVar32 + 0x20 + uVar42);
        auVar68._0_4_ = (*pfVar1 - fVar6) * fVar134;
        auVar68._4_4_ = (pfVar1[1] - fVar6) * fVar134;
        auVar68._8_4_ = (pfVar1[2] - fVar6) * fVar134;
        auVar68._12_4_ = (pfVar1[3] - fVar6) * fVar134;
        pfVar1 = (float *)(uVar32 + 0x20 + uVar41);
        auVar83._0_4_ = (*pfVar1 - fVar7) * fVar139;
        auVar83._4_4_ = (pfVar1[1] - fVar7) * fVar139;
        auVar83._8_4_ = (pfVar1[2] - fVar7) * fVar139;
        auVar83._12_4_ = (pfVar1[3] - fVar7) * fVar139;
        auVar67 = minps(auVar68,auVar83);
        pfVar1 = (float *)(uVar32 + 0x20 + uVar33);
        auVar84._0_4_ = (*pfVar1 - fVar8) * fVar144;
        auVar84._4_4_ = (pfVar1[1] - fVar8) * fVar144;
        auVar84._8_4_ = (pfVar1[2] - fVar8) * fVar144;
        auVar84._12_4_ = (pfVar1[3] - fVar8) * fVar144;
        auVar85 = minps(auVar84,auVar104);
        auVar85 = minps(auVar67,auVar85);
        auVar67._4_4_ = -(uint)(auVar48._4_4_ <= auVar85._4_4_);
        auVar67._0_4_ = -(uint)(auVar48._0_4_ <= auVar85._0_4_);
        auVar67._8_4_ = -(uint)(auVar48._8_4_ <= auVar85._8_4_);
        auVar67._12_4_ = -(uint)(auVar48._12_4_ <= auVar85._12_4_);
        uVar40 = movmskps((int)unaff_R12,auVar67);
        unaff_R12 = CONCAT44((int)(unaff_R12 >> 0x20),uVar40);
      }
      if ((uVar32 & 8) == 0) {
        if (unaff_R12 == 0) {
          uVar28 = 4;
        }
        else {
          uVar31 = uVar32 & 0xfffffffffffffff0;
          lVar35 = 0;
          if (unaff_R12 != 0) {
            for (; (unaff_R12 >> lVar35 & 1) == 0; lVar35 = lVar35 + 1) {
            }
          }
          uVar28 = 0;
          uVar32 = *(ulong *)(uVar31 + lVar35 * 8);
          uVar30 = unaff_R12 - 1 & unaff_R12;
          if (uVar30 != 0) {
            pNVar37->ptr = uVar32;
            lVar35 = 0;
            if (uVar30 != 0) {
              for (; (uVar30 >> lVar35 & 1) == 0; lVar35 = lVar35 + 1) {
              }
            }
            uVar43 = uVar30 - 1;
            while( true ) {
              pNVar37 = pNVar37 + 1;
              uVar32 = *(ulong *)(uVar31 + lVar35 * 8);
              uVar43 = uVar43 & uVar30;
              if (uVar43 == 0) break;
              pNVar37->ptr = uVar32;
              lVar35 = 0;
              if (uVar43 != 0) {
                for (; (uVar43 >> lVar35 & 1) == 0; lVar35 = lVar35 + 1) {
                }
              }
              uVar30 = uVar43 - 1;
            }
            uVar28 = 0;
          }
        }
      }
      else {
        uVar28 = 6;
      }
    } while (uVar28 == 0);
    if (uVar28 == 6) {
      uVar31 = (ulong)((uint)uVar32 & 0xf);
      uVar28 = 0;
      uVar30 = uVar31 - 8;
      bVar44 = uVar31 != 8;
      if (bVar44) {
        uVar32 = uVar32 & 0xfffffffffffffff0;
        uVar31 = 0;
        do {
          local_a88 = uVar31 * 0xe0;
          puVar5 = (undefined8 *)(uVar32 + 0xd0 + local_a88);
          local_978 = *puVar5;
          uStack_970 = puVar5[1];
          fVar138 = *(float *)(ray + k * 4);
          fVar102 = *(float *)(ray + k * 4 + 0x10);
          fVar81 = *(float *)(ray + k * 4 + 0x20);
          pfVar1 = (float *)(uVar32 + local_a88);
          pfVar2 = (float *)(uVar32 + 0x10 + local_a88);
          pfVar3 = (float *)(uVar32 + 0x20 + local_a88);
          pfVar4 = (float *)(uVar32 + 0x30 + local_a88);
          fVar162 = *pfVar1 - fVar138;
          fVar164 = pfVar1[1] - fVar138;
          fVar165 = pfVar1[2] - fVar138;
          fVar166 = pfVar1[3] - fVar138;
          local_a68 = *pfVar2 - fVar102;
          fStack_a64 = pfVar2[1] - fVar102;
          fStack_a60 = pfVar2[2] - fVar102;
          fStack_a5c = pfVar2[3] - fVar102;
          fVar145 = *pfVar3 - fVar81;
          fVar146 = pfVar3[1] - fVar81;
          fVar147 = pfVar3[2] - fVar81;
          fVar148 = pfVar3[3] - fVar81;
          fVar46 = *pfVar4 - fVar138;
          fVar61 = pfVar4[1] - fVar138;
          fVar63 = pfVar4[2] - fVar138;
          fVar64 = pfVar4[3] - fVar138;
          pfVar1 = (float *)(uVar32 + 0x40 + local_a88);
          fVar82 = *pfVar1 - fVar102;
          fVar91 = pfVar1[1] - fVar102;
          fVar92 = pfVar1[2] - fVar102;
          fVar93 = pfVar1[3] - fVar102;
          pfVar1 = (float *)(uVar32 + 0x50 + local_a88);
          fVar47 = *pfVar1 - fVar81;
          fVar62 = pfVar1[1] - fVar81;
          fStack_a80 = pfVar1[2] - fVar81;
          fStack_a7c = pfVar1[3] - fVar81;
          pfVar1 = (float *)(uVar32 + 0x90 + local_a88);
          fVar135 = *pfVar1 - fVar138;
          fVar136 = pfVar1[1] - fVar138;
          fVar137 = pfVar1[2] - fVar138;
          fVar138 = pfVar1[3] - fVar138;
          pfVar1 = (float *)(uVar32 + 0xa0 + local_a88);
          fVar94 = *pfVar1 - fVar102;
          fVar100 = pfVar1[1] - fVar102;
          fVar101 = pfVar1[2] - fVar102;
          fVar102 = pfVar1[3] - fVar102;
          pfVar1 = (float *)(uVar32 + 0xb0 + local_a88);
          fVar65 = *pfVar1 - fVar81;
          fVar79 = pfVar1[1] - fVar81;
          fVar80 = pfVar1[2] - fVar81;
          fVar81 = pfVar1[3] - fVar81;
          fVar113 = fVar135 - fVar162;
          fVar115 = fVar136 - fVar164;
          fVar117 = fVar137 - fVar165;
          fVar119 = fVar138 - fVar166;
          fVar140 = fVar94 - local_a68;
          fVar141 = fVar100 - fStack_a64;
          fVar142 = fVar101 - fStack_a60;
          fVar143 = fVar102 - fStack_a5c;
          fVar124 = fVar65 - fVar145;
          fVar128 = fVar79 - fVar146;
          fVar130 = fVar80 - fVar147;
          fVar132 = fVar81 - fVar148;
          fVar123 = *(float *)(ray + k * 4 + 0x50);
          fVar111 = *(float *)(ray + k * 4 + 0x60);
          fVar112 = *(float *)(ray + k * 4 + 0x40);
          local_968 = (fVar140 * (fVar145 + fVar65) - (local_a68 + fVar94) * fVar124) * fVar112 +
                      ((fVar162 + fVar135) * fVar124 - (fVar145 + fVar65) * fVar113) * fVar123 +
                      (fVar113 * (local_a68 + fVar94) - (fVar162 + fVar135) * fVar140) * fVar111;
          fStack_964 = (fVar141 * (fVar146 + fVar79) - (fStack_a64 + fVar100) * fVar128) * fVar112 +
                       ((fVar164 + fVar136) * fVar128 - (fVar146 + fVar79) * fVar115) * fVar123 +
                       (fVar115 * (fStack_a64 + fVar100) - (fVar164 + fVar136) * fVar141) * fVar111;
          fStack_960 = (fVar142 * (fVar147 + fVar80) - (fStack_a60 + fVar101) * fVar130) * fVar112 +
                       ((fVar165 + fVar137) * fVar130 - (fVar147 + fVar80) * fVar117) * fVar123 +
                       (fVar117 * (fStack_a60 + fVar101) - (fVar165 + fVar137) * fVar142) * fVar111;
          fStack_95c = (fVar143 * (fVar148 + fVar81) - (fStack_a5c + fVar102) * fVar132) * fVar112 +
                       ((fVar166 + fVar138) * fVar132 - (fVar148 + fVar81) * fVar119) * fVar123 +
                       (fVar119 * (fStack_a5c + fVar102) - (fVar166 + fVar138) * fVar143) * fVar111;
          fVar125 = fVar162 - fVar46;
          fVar129 = fVar164 - fVar61;
          fVar131 = fVar165 - fVar63;
          fVar133 = fVar166 - fVar64;
          fVar103 = local_a68 - fVar82;
          fVar106 = fStack_a64 - fVar91;
          fVar107 = fStack_a60 - fVar92;
          fVar108 = fStack_a5c - fVar93;
          fVar155 = fVar145 - fVar47;
          fVar158 = fVar146 - fVar62;
          fVar159 = fVar147 - fStack_a80;
          fVar160 = fVar148 - fStack_a7c;
          local_958 = (fVar103 * (fVar145 + fVar47) - (local_a68 + fVar82) * fVar155) * fVar112 +
                      ((fVar162 + fVar46) * fVar155 - (fVar145 + fVar47) * fVar125) * fVar123 +
                      (fVar125 * (local_a68 + fVar82) - (fVar162 + fVar46) * fVar103) * fVar111;
          fStack_954 = (fVar106 * (fVar146 + fVar62) - (fStack_a64 + fVar91) * fVar158) * fVar112 +
                       ((fVar164 + fVar61) * fVar158 - (fVar146 + fVar62) * fVar129) * fVar123 +
                       (fVar129 * (fStack_a64 + fVar91) - (fVar164 + fVar61) * fVar106) * fVar111;
          fStack_950 = (fVar107 * (fVar147 + fStack_a80) - (fStack_a60 + fVar92) * fVar159) *
                       fVar112 + ((fVar165 + fVar63) * fVar159 - (fVar147 + fStack_a80) * fVar131) *
                                 fVar123 + (fVar131 * (fStack_a60 + fVar92) -
                                           (fVar165 + fVar63) * fVar107) * fVar111;
          fStack_94c = (fVar108 * (fVar148 + fStack_a7c) - (fStack_a5c + fVar93) * fVar160) *
                       fVar112 + ((fVar166 + fVar64) * fVar160 - (fVar148 + fStack_a7c) * fVar133) *
                                 fVar123 + (fVar133 * (fStack_a5c + fVar93) -
                                           (fVar166 + fVar64) * fVar108) * fVar111;
          fVar114 = fVar46 - fVar135;
          fVar116 = fVar61 - fVar136;
          fVar118 = fVar63 - fVar137;
          fVar120 = fVar64 - fVar138;
          local_a78 = fVar82 - fVar94;
          fStack_a74 = fVar91 - fVar100;
          fStack_a70 = fVar92 - fVar101;
          fStack_a6c = fVar93 - fVar102;
          fVar150 = fVar47 - fVar65;
          fVar151 = fVar62 - fVar79;
          fVar152 = fStack_a80 - fVar80;
          fVar153 = fStack_a7c - fVar81;
          auVar86._0_4_ =
               (local_a78 * (fVar65 + fVar47) - (fVar94 + fVar82) * fVar150) * fVar112 +
               ((fVar135 + fVar46) * fVar150 - (fVar65 + fVar47) * fVar114) * fVar123 +
               (fVar114 * (fVar94 + fVar82) - (fVar135 + fVar46) * local_a78) * fVar111;
          auVar86._4_4_ =
               (fStack_a74 * (fVar79 + fVar62) - (fVar100 + fVar91) * fVar151) * fVar112 +
               ((fVar136 + fVar61) * fVar151 - (fVar79 + fVar62) * fVar116) * fVar123 +
               (fVar116 * (fVar100 + fVar91) - (fVar136 + fVar61) * fStack_a74) * fVar111;
          auVar86._8_4_ =
               (fStack_a70 * (fVar80 + fStack_a80) - (fVar101 + fVar92) * fVar152) * fVar112 +
               ((fVar137 + fVar63) * fVar152 - (fVar80 + fStack_a80) * fVar118) * fVar123 +
               (fVar118 * (fVar101 + fVar92) - (fVar137 + fVar63) * fStack_a70) * fVar111;
          auVar86._12_4_ =
               (fStack_a6c * (fVar81 + fStack_a7c) - (fVar102 + fVar93) * fVar153) * fVar112 +
               ((fVar138 + fVar64) * fVar153 - (fVar81 + fStack_a7c) * fVar120) * fVar123 +
               (fVar120 * (fVar102 + fVar93) - (fVar138 + fVar64) * fStack_a6c) * fVar111;
          fVar47 = local_958 + local_968 + auVar86._0_4_;
          fVar61 = fStack_954 + fStack_964 + auVar86._4_4_;
          fVar62 = fStack_950 + fStack_960 + auVar86._8_4_;
          fVar63 = fStack_94c + fStack_95c + auVar86._12_4_;
          auVar49._8_4_ = fStack_960;
          auVar49._0_8_ = CONCAT44(fStack_964,local_968);
          auVar49._12_4_ = fStack_95c;
          auVar19._4_4_ = fStack_954;
          auVar19._0_4_ = local_958;
          auVar19._8_4_ = fStack_950;
          auVar19._12_4_ = fStack_94c;
          auVar48 = minps(auVar49,auVar19);
          auVar48 = minps(auVar48,auVar86);
          auVar96._8_4_ = fStack_960;
          auVar96._0_8_ = CONCAT44(fStack_964,local_968);
          auVar96._12_4_ = fStack_95c;
          auVar20._4_4_ = fStack_954;
          auVar20._0_4_ = local_958;
          auVar20._8_4_ = fStack_950;
          auVar20._12_4_ = fStack_94c;
          auVar67 = maxps(auVar96,auVar20);
          auVar67 = maxps(auVar67,auVar86);
          fVar138 = ABS(fVar47) * 1.1920929e-07;
          fVar102 = ABS(fVar61) * 1.1920929e-07;
          fVar81 = ABS(fVar62) * 1.1920929e-07;
          fVar46 = ABS(fVar63) * 1.1920929e-07;
          auVar97._4_4_ = -(uint)(auVar67._4_4_ <= fVar102);
          auVar97._0_4_ = -(uint)(auVar67._0_4_ <= fVar138);
          auVar97._8_4_ = -(uint)(auVar67._8_4_ <= fVar81);
          auVar97._12_4_ = -(uint)(auVar67._12_4_ <= fVar46);
          auVar50._4_4_ = -(uint)(-fVar102 <= auVar48._4_4_);
          auVar50._0_4_ = -(uint)(-fVar138 <= auVar48._0_4_);
          auVar50._8_4_ = -(uint)(-fVar81 <= auVar48._8_4_);
          auVar50._12_4_ = -(uint)(-fVar46 <= auVar48._12_4_);
          auVar97 = auVar97 | auVar50;
          local_a88 = local_a88 + uVar32;
          iVar27 = movmskps((int)local_a88,auVar97);
          if (iVar27 != 0) {
            auVar105._0_4_ = fVar103 * fVar150 - fVar155 * local_a78;
            auVar105._4_4_ = fVar106 * fVar151 - fVar158 * fStack_a74;
            auVar105._8_4_ = fVar107 * fVar152 - fVar159 * fStack_a70;
            auVar105._12_4_ = fVar108 * fVar153 - fVar160 * fStack_a6c;
            auVar51._4_4_ = -(uint)(ABS(fVar106 * fVar128) < ABS(fVar158 * fStack_a74));
            auVar51._0_4_ = -(uint)(ABS(fVar103 * fVar124) < ABS(fVar155 * local_a78));
            auVar51._8_4_ = -(uint)(ABS(fVar107 * fVar130) < ABS(fVar159 * fStack_a70));
            auVar51._12_4_ = -(uint)(ABS(fVar108 * fVar132) < ABS(fVar160 * fStack_a6c));
            auVar15._4_4_ = fVar141 * fVar158 - fVar106 * fVar128;
            auVar15._0_4_ = fVar140 * fVar155 - fVar103 * fVar124;
            auVar15._8_4_ = fVar142 * fVar159 - fVar107 * fVar130;
            auVar15._12_4_ = fVar143 * fVar160 - fVar108 * fVar132;
            local_938 = blendvps(auVar105,auVar15,auVar51);
            auVar156._0_4_ = fVar155 * fVar114 - fVar125 * fVar150;
            auVar156._4_4_ = fVar158 * fVar116 - fVar129 * fVar151;
            auVar156._8_4_ = fVar159 * fVar118 - fVar131 * fVar152;
            auVar156._12_4_ = fVar160 * fVar120 - fVar133 * fVar153;
            auVar52._4_4_ = -(uint)(ABS(fVar158 * fVar115) < ABS(fVar129 * fVar151));
            auVar52._0_4_ = -(uint)(ABS(fVar155 * fVar113) < ABS(fVar125 * fVar150));
            auVar52._8_4_ = -(uint)(ABS(fVar159 * fVar117) < ABS(fVar131 * fVar152));
            auVar52._12_4_ = -(uint)(ABS(fVar160 * fVar119) < ABS(fVar133 * fVar153));
            auVar21._4_4_ = fVar128 * fVar129 - fVar158 * fVar115;
            auVar21._0_4_ = fVar124 * fVar125 - fVar155 * fVar113;
            auVar21._8_4_ = fVar130 * fVar131 - fVar159 * fVar117;
            auVar21._12_4_ = fVar132 * fVar133 - fVar160 * fVar119;
            local_928 = blendvps(auVar156,auVar21,auVar52);
            auVar126._0_4_ = fVar125 * local_a78 - fVar103 * fVar114;
            auVar126._4_4_ = fVar129 * fStack_a74 - fVar106 * fVar116;
            auVar126._8_4_ = fVar131 * fStack_a70 - fVar107 * fVar118;
            auVar126._12_4_ = fVar133 * fStack_a6c - fVar108 * fVar120;
            auVar53._4_4_ = -(uint)(ABS(fVar129 * fVar141) < ABS(fVar106 * fVar116));
            auVar53._0_4_ = -(uint)(ABS(fVar125 * fVar140) < ABS(fVar103 * fVar114));
            auVar53._8_4_ = -(uint)(ABS(fVar131 * fVar142) < ABS(fVar107 * fVar118));
            auVar53._12_4_ = -(uint)(ABS(fVar133 * fVar143) < ABS(fVar108 * fVar120));
            auVar25._4_4_ = fVar115 * fVar106 - fVar129 * fVar141;
            auVar25._0_4_ = fVar113 * fVar103 - fVar125 * fVar140;
            auVar25._8_4_ = fVar117 * fVar107 - fVar131 * fVar142;
            auVar25._12_4_ = fVar119 * fVar108 - fVar133 * fVar143;
            local_918 = blendvps(auVar126,auVar25,auVar53);
            fVar65 = fVar112 * local_938._0_4_ +
                     fVar123 * local_928._0_4_ + fVar111 * local_918._0_4_;
            fVar79 = fVar112 * local_938._4_4_ +
                     fVar123 * local_928._4_4_ + fVar111 * local_918._4_4_;
            fVar80 = fVar112 * local_938._8_4_ +
                     fVar123 * local_928._8_4_ + fVar111 * local_918._8_4_;
            fVar82 = fVar112 * local_938._12_4_ +
                     fVar123 * local_928._12_4_ + fVar111 * local_918._12_4_;
            fVar65 = fVar65 + fVar65;
            fVar79 = fVar79 + fVar79;
            fVar80 = fVar80 + fVar80;
            fVar82 = fVar82 + fVar82;
            auVar69._0_4_ = fVar145 * local_918._0_4_;
            auVar69._4_4_ = fVar146 * local_918._4_4_;
            auVar69._8_4_ = fVar147 * local_918._8_4_;
            auVar69._12_4_ = fVar148 * local_918._12_4_;
            fVar111 = fVar162 * local_938._0_4_ + local_a68 * local_928._0_4_ + auVar69._0_4_;
            fVar112 = fVar164 * local_938._4_4_ + fStack_a64 * local_928._4_4_ + auVar69._4_4_;
            fVar46 = fVar165 * local_938._8_4_ + fStack_a60 * local_928._8_4_ + auVar69._8_4_;
            fVar64 = fVar166 * local_938._12_4_ + fStack_a5c * local_928._12_4_ + auVar69._12_4_;
            auVar17._4_4_ = fVar79;
            auVar17._0_4_ = fVar65;
            auVar17._8_4_ = fVar80;
            auVar17._12_4_ = fVar82;
            auVar48 = rcpps(auVar69,auVar17);
            fVar138 = auVar48._0_4_;
            fVar102 = auVar48._4_4_;
            fVar81 = auVar48._8_4_;
            fVar123 = auVar48._12_4_;
            local_8d8._0_4_ = ((1.0 - fVar65 * fVar138) * fVar138 + fVar138) * (fVar111 + fVar111);
            local_8d8._4_4_ = ((1.0 - fVar79 * fVar102) * fVar102 + fVar102) * (fVar112 + fVar112);
            fStack_8d0 = ((1.0 - fVar80 * fVar81) * fVar81 + fVar81) * (fVar46 + fVar46);
            fStack_8cc = ((1.0 - fVar82 * fVar123) * fVar123 + fVar123) * (fVar64 + fVar64);
            fVar138 = *(float *)(ray + k * 4 + 0x80);
            fVar102 = *(float *)(ray + k * 4 + 0x30);
            auVar87._4_4_ = -(uint)(fVar102 <= (float)local_8d8._4_4_);
            auVar87._0_4_ = -(uint)(fVar102 <= (float)local_8d8._0_4_);
            auVar87._8_4_ = -(uint)(fVar102 <= fStack_8d0);
            auVar87._12_4_ = -(uint)(fVar102 <= fStack_8cc);
            auVar70._0_4_ =
                 -(uint)((float)local_8d8._0_4_ <= fVar138 && fVar102 <= (float)local_8d8._0_4_) &
                 auVar97._0_4_;
            auVar70._4_4_ =
                 -(uint)((float)local_8d8._4_4_ <= fVar138 && fVar102 <= (float)local_8d8._4_4_) &
                 auVar97._4_4_;
            auVar70._8_4_ = -(uint)(fStack_8d0 <= fVar138 && fVar102 <= fStack_8d0) & auVar97._8_4_;
            auVar70._12_4_ =
                 -(uint)(fStack_8cc <= fVar138 && fVar102 <= fStack_8cc) & auVar97._12_4_;
            iVar27 = movmskps(iVar27,auVar70);
            if (iVar27 != 0) {
              local_908._0_4_ = auVar70._0_4_ & -(uint)(fVar65 != 0.0);
              local_908._4_4_ = auVar70._4_4_ & -(uint)(fVar79 != 0.0);
              local_908._8_4_ = auVar70._8_4_ & -(uint)(fVar80 != 0.0);
              local_908._12_4_ = auVar70._12_4_ & -(uint)(fVar82 != 0.0);
              uVar28 = movmskps(iVar27,local_908);
              if (uVar28 != 0) {
                local_948._4_4_ = fVar61;
                local_948._0_4_ = fVar47;
                local_948._8_4_ = fVar62;
                local_948._12_4_ = fVar63;
                local_898._8_8_ = uStack_7e0;
                local_898._0_8_ = local_7e8;
                pSVar10 = context->scene;
                auVar48 = rcpps(auVar87,local_948);
                fVar81 = auVar48._0_4_;
                fVar123 = auVar48._4_4_;
                fVar111 = auVar48._8_4_;
                fVar112 = auVar48._12_4_;
                fVar46 = DAT_01feca10._4_4_;
                fVar64 = DAT_01feca10._12_4_;
                fVar138 = (float)DAT_01feca10;
                fVar102 = DAT_01feca10._8_4_;
                fVar81 = (float)(-(uint)(1e-18 <= ABS(fVar47)) &
                                (uint)((fVar138 - fVar47 * fVar81) * fVar81 + fVar81));
                fVar123 = (float)(-(uint)(1e-18 <= ABS(fVar61)) &
                                 (uint)((fVar46 - fVar61 * fVar123) * fVar123 + fVar123));
                fVar111 = (float)(-(uint)(1e-18 <= ABS(fVar62)) &
                                 (uint)((fVar102 - fVar62 * fVar111) * fVar111 + fVar111));
                fVar112 = (float)(-(uint)(1e-18 <= ABS(fVar63)) &
                                 (uint)((fVar64 - fVar63 * fVar112) * fVar112 + fVar112));
                auVar109._0_4_ = local_968 * fVar81;
                auVar109._4_4_ = fStack_964 * fVar123;
                auVar109._8_4_ = fStack_960 * fVar111;
                auVar109._12_4_ = fStack_95c * fVar112;
                auVar48 = minps(auVar109,_DAT_01feca10);
                auVar121._0_4_ = fVar81 * local_958;
                auVar121._4_4_ = fVar123 * fStack_954;
                auVar121._8_4_ = fVar111 * fStack_950;
                auVar121._12_4_ = fVar112 * fStack_94c;
                auVar67 = minps(auVar121,_DAT_01feca10);
                auVar71._0_4_ = fVar138 - auVar48._0_4_;
                auVar71._4_4_ = fVar46 - auVar48._4_4_;
                auVar71._8_4_ = fVar102 - auVar48._8_4_;
                auVar71._12_4_ = fVar64 - auVar48._12_4_;
                auVar88._0_4_ = fVar138 - auVar67._0_4_;
                auVar88._4_4_ = fVar46 - auVar67._4_4_;
                auVar88._8_4_ = fVar102 - auVar67._8_4_;
                auVar88._12_4_ = fVar64 - auVar67._12_4_;
                local_8f8 = blendvps(auVar48,auVar71,local_898);
                local_8e8 = blendvps(auVar67,auVar88,local_898);
                local_8c8 = local_938;
                local_8b8 = local_928;
                local_8a8 = local_918;
                uVar43 = (ulong)(uVar28 & 0xff);
                do {
                  uVar33 = 0;
                  if (uVar43 != 0) {
                    for (; (uVar43 >> uVar33 & 1) == 0; uVar33 = uVar33 + 1) {
                    }
                  }
                  local_828 = *(uint *)(local_a88 + 0xc0 + uVar33 * 4);
                  pGVar11 = (pSVar10->geometries).items[local_828].ptr;
                  if ((pGVar11->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                    uVar43 = uVar43 ^ 1L << (uVar33 & 0x3f);
                    bVar45 = true;
                  }
                  else if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                          (pGVar11->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                    bVar45 = false;
                  }
                  else {
                    uVar40 = *(undefined4 *)(ray + k * 4 + 0x80);
                    local_858 = *(undefined4 *)(local_8f8 + uVar33 * 4);
                    uVar9 = *(undefined4 *)(local_8e8 + uVar33 * 4);
                    *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_8d8 + uVar33 * 4);
                    args.context = context->user;
                    local_838 = *(undefined4 *)((long)&local_978 + uVar33 * 4);
                    local_848._4_4_ = uVar9;
                    local_848._0_4_ = uVar9;
                    local_848._8_4_ = uVar9;
                    local_848._12_4_ = uVar9;
                    local_888 = *(undefined4 *)(local_8c8 + uVar33 * 4);
                    uVar9 = *(undefined4 *)(local_8b8 + uVar33 * 4);
                    local_868 = *(undefined4 *)(local_8a8 + uVar33 * 4);
                    local_878._4_4_ = uVar9;
                    local_878._0_4_ = uVar9;
                    local_878._8_4_ = uVar9;
                    local_878._12_4_ = uVar9;
                    uStack_884 = local_888;
                    uStack_880 = local_888;
                    uStack_87c = local_888;
                    uStack_864 = local_868;
                    uStack_860 = local_868;
                    uStack_85c = local_868;
                    uStack_854 = local_858;
                    uStack_850 = local_858;
                    uStack_84c = local_858;
                    uStack_834 = local_838;
                    uStack_830 = local_838;
                    uStack_82c = local_838;
                    uStack_824 = local_828;
                    uStack_820 = local_828;
                    uStack_81c = local_828;
                    local_818 = (args.context)->instID[0];
                    uStack_814 = local_818;
                    uStack_810 = local_818;
                    uStack_80c = local_818;
                    local_808 = (args.context)->instPrimID[0];
                    uStack_804 = local_808;
                    uStack_800 = local_808;
                    uStack_7fc = local_808;
                    local_ab8 = *local_a50;
                    args.valid = (int *)local_ab8;
                    args.geometryUserPtr = pGVar11->userPtr;
                    args.hit = (RTCHitN *)&local_888;
                    args.N = 4;
                    pRVar29 = (RTCRayN *)pGVar11->occlusionFilterN;
                    args.ray = (RTCRayN *)ray;
                    if (pRVar29 != (RTCRayN *)0x0) {
                      pRVar29 = (RTCRayN *)(*(code *)pRVar29)(&args);
                    }
                    if (local_ab8 == (undefined1  [16])0x0) {
                      auVar72._8_4_ = 0xffffffff;
                      auVar72._0_8_ = 0xffffffffffffffff;
                      auVar72._12_4_ = 0xffffffff;
                      auVar72 = auVar72 ^ _DAT_01febe20;
                    }
                    else {
                      p_Var12 = context->args->filter;
                      if ((p_Var12 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar11->field_8).field_0x2 & 0x40) != 0)))) {
                        (*p_Var12)(&args);
                      }
                      auVar54._0_4_ = -(uint)(local_ab8._0_4_ == 0);
                      auVar54._4_4_ = -(uint)(local_ab8._4_4_ == 0);
                      auVar54._8_4_ = -(uint)(local_ab8._8_4_ == 0);
                      auVar54._12_4_ = -(uint)(local_ab8._12_4_ == 0);
                      auVar72 = auVar54 ^ _DAT_01febe20;
                      auVar48 = blendvps(_DAT_01feba00,*(undefined1 (*) [16])(args.ray + 0x80),
                                         auVar54);
                      *(undefined1 (*) [16])(args.ray + 0x80) = auVar48;
                      pRVar29 = args.ray;
                    }
                    auVar73._0_4_ = auVar72._0_4_ << 0x1f;
                    auVar73._4_4_ = auVar72._4_4_ << 0x1f;
                    auVar73._8_4_ = auVar72._8_4_ << 0x1f;
                    auVar73._12_4_ = auVar72._12_4_ << 0x1f;
                    iVar27 = movmskps((int)pRVar29,auVar73);
                    bVar45 = iVar27 == 0;
                    if (bVar45) {
                      *(undefined4 *)(ray + k * 4 + 0x80) = uVar40;
                      uVar43 = uVar43 ^ 1L << (uVar33 & 0x3f);
                    }
                  }
                  if (!bVar45) goto LAB_0028f68e;
                  uVar33 = local_aa0;
                  uVar41 = local_a98;
                  uVar42 = local_a90;
                } while (uVar43 != 0);
              }
            }
          }
          fVar138 = *(float *)(ray + k * 4);
          fVar102 = *(float *)(ray + k * 4 + 0x10);
          fVar81 = *(float *)(ray + k * 4 + 0x20);
          fVar136 = *(float *)(local_a88 + 0x60) - fVar138;
          fVar140 = *(float *)(local_a88 + 100) - fVar138;
          fVar142 = *(float *)(local_a88 + 0x68) - fVar138;
          fVar145 = *(float *)(local_a88 + 0x6c) - fVar138;
          local_a78 = *(float *)(local_a88 + 0x70) - fVar102;
          fStack_a74 = *(float *)(local_a88 + 0x74) - fVar102;
          fStack_a70 = *(float *)(local_a88 + 0x78) - fVar102;
          fStack_a6c = *(float *)(local_a88 + 0x7c) - fVar102;
          fVar131 = *(float *)(local_a88 + 0x80) - fVar81;
          fVar132 = *(float *)(local_a88 + 0x84) - fVar81;
          fVar133 = *(float *)(local_a88 + 0x88) - fVar81;
          fVar135 = *(float *)(local_a88 + 0x8c) - fVar81;
          fVar79 = *(float *)(local_a88 + 0x90) - fVar138;
          fVar80 = *(float *)(local_a88 + 0x94) - fVar138;
          fVar82 = *(float *)(local_a88 + 0x98) - fVar138;
          fVar91 = *(float *)(local_a88 + 0x9c) - fVar138;
          fVar147 = *(float *)(local_a88 + 0xa0) - fVar102;
          fVar150 = *(float *)(local_a88 + 0xa4) - fVar102;
          fVar152 = *(float *)(local_a88 + 0xa8) - fVar102;
          fVar155 = *(float *)(local_a88 + 0xac) - fVar102;
          fVar46 = *(float *)(local_a88 + 0xb0) - fVar81;
          fVar47 = *(float *)(local_a88 + 0xb4) - fVar81;
          fVar61 = *(float *)(local_a88 + 0xb8) - fVar81;
          fVar62 = *(float *)(local_a88 + 0xbc) - fVar81;
          fVar115 = *(float *)(local_a88 + 0x30) - fVar138;
          fVar116 = *(float *)(local_a88 + 0x34) - fVar138;
          fVar117 = *(float *)(local_a88 + 0x38) - fVar138;
          fVar138 = *(float *)(local_a88 + 0x3c) - fVar138;
          fVar63 = *(float *)(local_a88 + 0x40) - fVar102;
          fVar64 = *(float *)(local_a88 + 0x44) - fVar102;
          fVar65 = *(float *)(local_a88 + 0x48) - fVar102;
          fVar102 = *(float *)(local_a88 + 0x4c) - fVar102;
          fVar92 = *(float *)(local_a88 + 0x50) - fVar81;
          fVar93 = *(float *)(local_a88 + 0x54) - fVar81;
          fVar94 = *(float *)(local_a88 + 0x58) - fVar81;
          fVar81 = *(float *)(local_a88 + 0x5c) - fVar81;
          fVar100 = fVar115 - fVar136;
          fVar103 = fVar116 - fVar140;
          fVar107 = fVar117 - fVar142;
          fVar113 = fVar138 - fVar145;
          fVar159 = fVar63 - local_a78;
          fVar162 = fVar64 - fStack_a74;
          fVar165 = fVar65 - fStack_a70;
          fVar167 = fVar102 - fStack_a6c;
          fVar125 = fVar92 - fVar131;
          fVar128 = fVar93 - fVar132;
          fVar129 = fVar94 - fVar133;
          fVar130 = fVar81 - fVar135;
          fVar123 = *(float *)(ray + k * 4 + 0x50);
          fVar111 = *(float *)(ray + k * 4 + 0x60);
          fVar112 = *(float *)(ray + k * 4 + 0x40);
          local_968 = (fVar159 * (fVar131 + fVar92) - (local_a78 + fVar63) * fVar125) * fVar112 +
                      ((fVar136 + fVar115) * fVar125 - (fVar131 + fVar92) * fVar100) * fVar123 +
                      (fVar100 * (local_a78 + fVar63) - (fVar136 + fVar115) * fVar159) * fVar111;
          fStack_964 = (fVar162 * (fVar132 + fVar93) - (fStack_a74 + fVar64) * fVar128) * fVar112 +
                       ((fVar140 + fVar116) * fVar128 - (fVar132 + fVar93) * fVar103) * fVar123 +
                       (fVar103 * (fStack_a74 + fVar64) - (fVar140 + fVar116) * fVar162) * fVar111;
          fStack_960 = (fVar165 * (fVar133 + fVar94) - (fStack_a70 + fVar65) * fVar129) * fVar112 +
                       ((fVar142 + fVar117) * fVar129 - (fVar133 + fVar94) * fVar107) * fVar123 +
                       (fVar107 * (fStack_a70 + fVar65) - (fVar142 + fVar117) * fVar165) * fVar111;
          fStack_95c = (fVar167 * (fVar135 + fVar81) - (fStack_a6c + fVar102) * fVar130) * fVar112 +
                       ((fVar145 + fVar138) * fVar130 - (fVar135 + fVar81) * fVar113) * fVar123 +
                       (fVar113 * (fStack_a6c + fVar102) - (fVar145 + fVar138) * fVar167) * fVar111;
          fVar101 = fVar136 - fVar79;
          fVar106 = fVar140 - fVar80;
          fVar108 = fVar142 - fVar82;
          fVar114 = fVar145 - fVar91;
          fVar160 = local_a78 - fVar147;
          fVar164 = fStack_a74 - fVar150;
          fVar166 = fStack_a70 - fVar152;
          fVar168 = fStack_a6c - fVar155;
          fVar148 = fVar131 - fVar46;
          fVar151 = fVar132 - fVar47;
          fVar153 = fVar133 - fVar61;
          fVar158 = fVar135 - fVar62;
          local_958 = (fVar160 * (fVar131 + fVar46) - (local_a78 + fVar147) * fVar148) * fVar112 +
                      ((fVar136 + fVar79) * fVar148 - (fVar131 + fVar46) * fVar101) * fVar123 +
                      (fVar101 * (local_a78 + fVar147) - (fVar136 + fVar79) * fVar160) * fVar111;
          fStack_954 = (fVar164 * (fVar132 + fVar47) - (fStack_a74 + fVar150) * fVar151) * fVar112 +
                       ((fVar140 + fVar80) * fVar151 - (fVar132 + fVar47) * fVar106) * fVar123 +
                       (fVar106 * (fStack_a74 + fVar150) - (fVar140 + fVar80) * fVar164) * fVar111;
          fStack_950 = (fVar166 * (fVar133 + fVar61) - (fStack_a70 + fVar152) * fVar153) * fVar112 +
                       ((fVar142 + fVar82) * fVar153 - (fVar133 + fVar61) * fVar108) * fVar123 +
                       (fVar108 * (fStack_a70 + fVar152) - (fVar142 + fVar82) * fVar166) * fVar111;
          fStack_94c = (fVar168 * (fVar135 + fVar62) - (fStack_a6c + fVar155) * fVar158) * fVar112 +
                       ((fVar145 + fVar91) * fVar158 - (fVar135 + fVar62) * fVar114) * fVar123 +
                       (fVar114 * (fStack_a6c + fVar155) - (fVar145 + fVar91) * fVar168) * fVar111;
          local_a68 = fVar79 - fVar115;
          fStack_a64 = fVar80 - fVar116;
          fStack_a60 = fVar82 - fVar117;
          fStack_a5c = fVar91 - fVar138;
          fVar118 = fVar147 - fVar63;
          fVar119 = fVar150 - fVar64;
          fVar120 = fVar152 - fVar65;
          fVar124 = fVar155 - fVar102;
          fVar137 = fVar46 - fVar92;
          fVar141 = fVar47 - fVar93;
          fVar143 = fVar61 - fVar94;
          fVar146 = fVar62 - fVar81;
          fVar46 = (fVar118 * (fVar92 + fVar46) - (fVar63 + fVar147) * fVar137) * fVar112 +
                   ((fVar115 + fVar79) * fVar137 - (fVar92 + fVar46) * local_a68) * fVar123 +
                   (local_a68 * (fVar63 + fVar147) - (fVar115 + fVar79) * fVar118) * fVar111;
          fVar47 = (fVar119 * (fVar93 + fVar47) - (fVar64 + fVar150) * fVar141) * fVar112 +
                   ((fVar116 + fVar80) * fVar141 - (fVar93 + fVar47) * fStack_a64) * fVar123 +
                   (fStack_a64 * (fVar64 + fVar150) - (fVar116 + fVar80) * fVar119) * fVar111;
          fVar61 = (fVar120 * (fVar94 + fVar61) - (fVar65 + fVar152) * fVar143) * fVar112 +
                   ((fVar117 + fVar82) * fVar143 - (fVar94 + fVar61) * fStack_a60) * fVar123 +
                   (fStack_a60 * (fVar65 + fVar152) - (fVar117 + fVar82) * fVar120) * fVar111;
          fVar138 = (fVar124 * (fVar81 + fVar62) - (fVar102 + fVar155) * fVar146) * fVar112 +
                    ((fVar138 + fVar91) * fVar146 - (fVar81 + fVar62) * fStack_a5c) * fVar123 +
                    (fStack_a5c * (fVar102 + fVar155) - (fVar138 + fVar91) * fVar124) * fVar111;
          fVar62 = local_958 + local_968 + fVar46;
          fVar63 = fStack_954 + fStack_964 + fVar47;
          fVar64 = fStack_950 + fStack_960 + fVar61;
          fVar65 = fStack_94c + fStack_95c + fVar138;
          auVar55._8_4_ = fStack_960;
          auVar55._0_8_ = CONCAT44(fStack_964,local_968);
          auVar55._12_4_ = fStack_95c;
          auVar22._4_4_ = fStack_954;
          auVar22._0_4_ = local_958;
          auVar22._8_4_ = fStack_950;
          auVar22._12_4_ = fStack_94c;
          auVar48 = minps(auVar55,auVar22);
          auVar13._4_4_ = fVar47;
          auVar13._0_4_ = fVar46;
          auVar13._8_4_ = fVar61;
          auVar13._12_4_ = fVar138;
          auVar48 = minps(auVar48,auVar13);
          auVar98._8_4_ = fStack_960;
          auVar98._0_8_ = CONCAT44(fStack_964,local_968);
          auVar98._12_4_ = fStack_95c;
          auVar23._4_4_ = fStack_954;
          auVar23._0_4_ = local_958;
          auVar23._8_4_ = fStack_950;
          auVar23._12_4_ = fStack_94c;
          auVar67 = maxps(auVar98,auVar23);
          auVar14._4_4_ = fVar47;
          auVar14._0_4_ = fVar46;
          auVar14._8_4_ = fVar61;
          auVar14._12_4_ = fVar138;
          auVar67 = maxps(auVar67,auVar14);
          fVar138 = ABS(fVar62) * 1.1920929e-07;
          fVar102 = ABS(fVar63) * 1.1920929e-07;
          fVar81 = ABS(fVar64) * 1.1920929e-07;
          fVar46 = ABS(fVar65) * 1.1920929e-07;
          auVar99._4_4_ = -(uint)(auVar67._4_4_ <= fVar102);
          auVar99._0_4_ = -(uint)(auVar67._0_4_ <= fVar138);
          auVar99._8_4_ = -(uint)(auVar67._8_4_ <= fVar81);
          auVar99._12_4_ = -(uint)(auVar67._12_4_ <= fVar46);
          auVar56._4_4_ = -(uint)(-fVar102 <= auVar48._4_4_);
          auVar56._0_4_ = -(uint)(-fVar138 <= auVar48._0_4_);
          auVar56._8_4_ = -(uint)(-fVar81 <= auVar48._8_4_);
          auVar56._12_4_ = -(uint)(-fVar46 <= auVar48._12_4_);
          auVar99 = auVar99 | auVar56;
          iVar27 = movmskps((int)local_a88,auVar99);
          if (iVar27 != 0) {
            auVar163._0_4_ = fVar160 * fVar137 - fVar148 * fVar118;
            auVar163._4_4_ = fVar164 * fVar141 - fVar151 * fVar119;
            auVar163._8_4_ = fVar166 * fVar143 - fVar153 * fVar120;
            auVar163._12_4_ = fVar168 * fVar146 - fVar158 * fVar124;
            auVar57._4_4_ = -(uint)(ABS(fVar164 * fVar128) < ABS(fVar151 * fVar119));
            auVar57._0_4_ = -(uint)(ABS(fVar160 * fVar125) < ABS(fVar148 * fVar118));
            auVar57._8_4_ = -(uint)(ABS(fVar166 * fVar129) < ABS(fVar153 * fVar120));
            auVar57._12_4_ = -(uint)(ABS(fVar168 * fVar130) < ABS(fVar158 * fVar124));
            auVar16._4_4_ = fVar162 * fVar151 - fVar164 * fVar128;
            auVar16._0_4_ = fVar159 * fVar148 - fVar160 * fVar125;
            auVar16._8_4_ = fVar165 * fVar153 - fVar166 * fVar129;
            auVar16._12_4_ = fVar167 * fVar158 - fVar168 * fVar130;
            local_938 = blendvps(auVar163,auVar16,auVar57);
            auVar157._0_4_ = fVar148 * local_a68 - fVar101 * fVar137;
            auVar157._4_4_ = fVar151 * fStack_a64 - fVar106 * fVar141;
            auVar157._8_4_ = fVar153 * fStack_a60 - fVar108 * fVar143;
            auVar157._12_4_ = fVar158 * fStack_a5c - fVar114 * fVar146;
            auVar58._4_4_ = -(uint)(ABS(fVar151 * fVar103) < ABS(fVar106 * fVar141));
            auVar58._0_4_ = -(uint)(ABS(fVar148 * fVar100) < ABS(fVar101 * fVar137));
            auVar58._8_4_ = -(uint)(ABS(fVar153 * fVar107) < ABS(fVar108 * fVar143));
            auVar58._12_4_ = -(uint)(ABS(fVar158 * fVar113) < ABS(fVar114 * fVar146));
            auVar24._4_4_ = fVar128 * fVar106 - fVar151 * fVar103;
            auVar24._0_4_ = fVar125 * fVar101 - fVar148 * fVar100;
            auVar24._8_4_ = fVar129 * fVar108 - fVar153 * fVar107;
            auVar24._12_4_ = fVar130 * fVar114 - fVar158 * fVar113;
            local_928 = blendvps(auVar157,auVar24,auVar58);
            auVar122._0_4_ = fVar101 * fVar118 - fVar160 * local_a68;
            auVar122._4_4_ = fVar106 * fVar119 - fVar164 * fStack_a64;
            auVar122._8_4_ = fVar108 * fVar120 - fVar166 * fStack_a60;
            auVar122._12_4_ = fVar114 * fVar124 - fVar168 * fStack_a5c;
            auVar59._4_4_ = -(uint)(ABS(fVar106 * fVar162) < ABS(fVar164 * fStack_a64));
            auVar59._0_4_ = -(uint)(ABS(fVar101 * fVar159) < ABS(fVar160 * local_a68));
            auVar59._8_4_ = -(uint)(ABS(fVar108 * fVar165) < ABS(fVar166 * fStack_a60));
            auVar59._12_4_ = -(uint)(ABS(fVar114 * fVar167) < ABS(fVar168 * fStack_a5c));
            auVar26._4_4_ = fVar103 * fVar164 - fVar106 * fVar162;
            auVar26._0_4_ = fVar100 * fVar160 - fVar101 * fVar159;
            auVar26._8_4_ = fVar107 * fVar166 - fVar108 * fVar165;
            auVar26._12_4_ = fVar113 * fVar168 - fVar114 * fVar167;
            local_918 = blendvps(auVar122,auVar26,auVar59);
            fVar61 = fVar112 * local_938._0_4_ +
                     fVar123 * local_928._0_4_ + fVar111 * local_918._0_4_;
            fVar79 = fVar112 * local_938._4_4_ +
                     fVar123 * local_928._4_4_ + fVar111 * local_918._4_4_;
            fVar80 = fVar112 * local_938._8_4_ +
                     fVar123 * local_928._8_4_ + fVar111 * local_918._8_4_;
            fVar82 = fVar112 * local_938._12_4_ +
                     fVar123 * local_928._12_4_ + fVar111 * local_918._12_4_;
            fVar61 = fVar61 + fVar61;
            fVar79 = fVar79 + fVar79;
            fVar80 = fVar80 + fVar80;
            fVar82 = fVar82 + fVar82;
            auVar74._0_4_ = fVar131 * local_918._0_4_;
            auVar74._4_4_ = fVar132 * local_918._4_4_;
            auVar74._8_4_ = fVar133 * local_918._8_4_;
            auVar74._12_4_ = fVar135 * local_918._12_4_;
            fVar111 = fVar136 * local_938._0_4_ + local_a78 * local_928._0_4_ + auVar74._0_4_;
            fVar112 = fVar140 * local_938._4_4_ + fStack_a74 * local_928._4_4_ + auVar74._4_4_;
            fVar46 = fVar142 * local_938._8_4_ + fStack_a70 * local_928._8_4_ + auVar74._8_4_;
            fVar47 = fVar145 * local_938._12_4_ + fStack_a6c * local_928._12_4_ + auVar74._12_4_;
            auVar18._4_4_ = fVar79;
            auVar18._0_4_ = fVar61;
            auVar18._8_4_ = fVar80;
            auVar18._12_4_ = fVar82;
            auVar48 = rcpps(auVar74,auVar18);
            fVar138 = auVar48._0_4_;
            fVar102 = auVar48._4_4_;
            fVar81 = auVar48._8_4_;
            fVar123 = auVar48._12_4_;
            local_8d8._0_4_ = ((1.0 - fVar61 * fVar138) * fVar138 + fVar138) * (fVar111 + fVar111);
            local_8d8._4_4_ = ((1.0 - fVar79 * fVar102) * fVar102 + fVar102) * (fVar112 + fVar112);
            fStack_8d0 = ((1.0 - fVar80 * fVar81) * fVar81 + fVar81) * (fVar46 + fVar46);
            fStack_8cc = ((1.0 - fVar82 * fVar123) * fVar123 + fVar123) * (fVar47 + fVar47);
            fVar138 = *(float *)(ray + k * 4 + 0x80);
            fVar102 = *(float *)(ray + k * 4 + 0x30);
            auVar89._4_4_ = -(uint)(fVar102 <= (float)local_8d8._4_4_);
            auVar89._0_4_ = -(uint)(fVar102 <= (float)local_8d8._0_4_);
            auVar89._8_4_ = -(uint)(fVar102 <= fStack_8d0);
            auVar89._12_4_ = -(uint)(fVar102 <= fStack_8cc);
            auVar75._0_4_ =
                 -(uint)((float)local_8d8._0_4_ <= fVar138 && fVar102 <= (float)local_8d8._0_4_) &
                 auVar99._0_4_;
            auVar75._4_4_ =
                 -(uint)((float)local_8d8._4_4_ <= fVar138 && fVar102 <= (float)local_8d8._4_4_) &
                 auVar99._4_4_;
            auVar75._8_4_ = -(uint)(fStack_8d0 <= fVar138 && fVar102 <= fStack_8d0) & auVar99._8_4_;
            auVar75._12_4_ =
                 -(uint)(fStack_8cc <= fVar138 && fVar102 <= fStack_8cc) & auVar99._12_4_;
            iVar27 = movmskps(iVar27,auVar75);
            if (iVar27 != 0) {
              local_908._0_4_ = auVar75._0_4_ & -(uint)(fVar61 != 0.0);
              local_908._4_4_ = auVar75._4_4_ & -(uint)(fVar79 != 0.0);
              local_908._8_4_ = auVar75._8_4_ & -(uint)(fVar80 != 0.0);
              local_908._12_4_ = auVar75._12_4_ & -(uint)(fVar82 != 0.0);
              uVar28 = movmskps(iVar27,local_908);
              if (uVar28 != 0) {
                local_948._4_4_ = fVar63;
                local_948._0_4_ = fVar62;
                local_948._8_4_ = fVar64;
                local_948._12_4_ = fVar65;
                local_898 = local_7f8;
                pSVar10 = context->scene;
                auVar48 = rcpps(auVar89,local_948);
                fVar81 = auVar48._0_4_;
                fVar123 = auVar48._4_4_;
                fVar111 = auVar48._8_4_;
                fVar112 = auVar48._12_4_;
                fVar46 = DAT_01feca10._4_4_;
                fVar47 = DAT_01feca10._12_4_;
                fVar138 = (float)DAT_01feca10;
                fVar102 = DAT_01feca10._8_4_;
                fVar81 = (float)(-(uint)(1e-18 <= ABS(fVar62)) &
                                (uint)((fVar138 - fVar62 * fVar81) * fVar81 + fVar81));
                fVar123 = (float)(-(uint)(1e-18 <= ABS(fVar63)) &
                                 (uint)((fVar46 - fVar63 * fVar123) * fVar123 + fVar123));
                fVar111 = (float)(-(uint)(1e-18 <= ABS(fVar64)) &
                                 (uint)((fVar102 - fVar64 * fVar111) * fVar111 + fVar111));
                fVar112 = (float)(-(uint)(1e-18 <= ABS(fVar65)) &
                                 (uint)((fVar47 - fVar65 * fVar112) * fVar112 + fVar112));
                auVar110._0_4_ = local_968 * fVar81;
                auVar110._4_4_ = fStack_964 * fVar123;
                auVar110._8_4_ = fStack_960 * fVar111;
                auVar110._12_4_ = fStack_95c * fVar112;
                auVar48 = minps(auVar110,_DAT_01feca10);
                auVar127._0_4_ = fVar81 * local_958;
                auVar127._4_4_ = fVar123 * fStack_954;
                auVar127._8_4_ = fVar111 * fStack_950;
                auVar127._12_4_ = fVar112 * fStack_94c;
                auVar67 = minps(auVar127,_DAT_01feca10);
                auVar76._0_4_ = fVar138 - auVar48._0_4_;
                auVar76._4_4_ = fVar46 - auVar48._4_4_;
                auVar76._8_4_ = fVar102 - auVar48._8_4_;
                auVar76._12_4_ = fVar47 - auVar48._12_4_;
                auVar90._0_4_ = fVar138 - auVar67._0_4_;
                auVar90._4_4_ = fVar46 - auVar67._4_4_;
                auVar90._8_4_ = fVar102 - auVar67._8_4_;
                auVar90._12_4_ = fVar47 - auVar67._12_4_;
                local_8f8 = blendvps(auVar48,auVar76,local_7f8);
                local_8e8 = blendvps(auVar67,auVar90,local_7f8);
                local_8c8 = local_938;
                local_8b8 = local_928;
                local_8a8 = local_918;
                uVar43 = (ulong)(uVar28 & 0xff);
                do {
                  uVar33 = 0;
                  if (uVar43 != 0) {
                    for (; (uVar43 >> uVar33 & 1) == 0; uVar33 = uVar33 + 1) {
                    }
                  }
                  local_828 = *(uint *)(local_a88 + 0xc0 + uVar33 * 4);
                  pGVar11 = (pSVar10->geometries).items[local_828].ptr;
                  if ((pGVar11->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                    uVar43 = uVar43 ^ 1L << (uVar33 & 0x3f);
                    bVar45 = true;
                  }
                  else if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                          (pGVar11->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                    bVar45 = false;
                  }
                  else {
                    uVar40 = *(undefined4 *)(ray + k * 4 + 0x80);
                    local_858 = *(undefined4 *)(local_8f8 + uVar33 * 4);
                    uVar9 = *(undefined4 *)(local_8e8 + uVar33 * 4);
                    *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_8d8 + uVar33 * 4);
                    args.context = context->user;
                    local_838 = *(undefined4 *)((long)&local_978 + uVar33 * 4);
                    local_848._4_4_ = uVar9;
                    local_848._0_4_ = uVar9;
                    local_848._8_4_ = uVar9;
                    local_848._12_4_ = uVar9;
                    local_888 = *(undefined4 *)(local_8c8 + uVar33 * 4);
                    uVar9 = *(undefined4 *)(local_8b8 + uVar33 * 4);
                    local_868 = *(undefined4 *)(local_8a8 + uVar33 * 4);
                    local_878._4_4_ = uVar9;
                    local_878._0_4_ = uVar9;
                    local_878._8_4_ = uVar9;
                    local_878._12_4_ = uVar9;
                    uStack_884 = local_888;
                    uStack_880 = local_888;
                    uStack_87c = local_888;
                    uStack_864 = local_868;
                    uStack_860 = local_868;
                    uStack_85c = local_868;
                    uStack_854 = local_858;
                    uStack_850 = local_858;
                    uStack_84c = local_858;
                    uStack_834 = local_838;
                    uStack_830 = local_838;
                    uStack_82c = local_838;
                    uStack_824 = local_828;
                    uStack_820 = local_828;
                    uStack_81c = local_828;
                    local_818 = (args.context)->instID[0];
                    uStack_814 = local_818;
                    uStack_810 = local_818;
                    uStack_80c = local_818;
                    local_808 = (args.context)->instPrimID[0];
                    uStack_804 = local_808;
                    uStack_800 = local_808;
                    uStack_7fc = local_808;
                    local_ab8 = *local_a50;
                    args.valid = (int *)local_ab8;
                    args.geometryUserPtr = pGVar11->userPtr;
                    args.hit = (RTCHitN *)&local_888;
                    args.N = 4;
                    pRVar29 = (RTCRayN *)pGVar11->occlusionFilterN;
                    args.ray = (RTCRayN *)ray;
                    if (pRVar29 != (RTCRayN *)0x0) {
                      pRVar29 = (RTCRayN *)(*(code *)pRVar29)(&args);
                    }
                    if (local_ab8 == (undefined1  [16])0x0) {
                      auVar77._8_4_ = 0xffffffff;
                      auVar77._0_8_ = 0xffffffffffffffff;
                      auVar77._12_4_ = 0xffffffff;
                      auVar77 = auVar77 ^ _DAT_01febe20;
                    }
                    else {
                      p_Var12 = context->args->filter;
                      if ((p_Var12 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar11->field_8).field_0x2 & 0x40) != 0)))) {
                        (*p_Var12)(&args);
                      }
                      auVar60._0_4_ = -(uint)(local_ab8._0_4_ == 0);
                      auVar60._4_4_ = -(uint)(local_ab8._4_4_ == 0);
                      auVar60._8_4_ = -(uint)(local_ab8._8_4_ == 0);
                      auVar60._12_4_ = -(uint)(local_ab8._12_4_ == 0);
                      auVar77 = auVar60 ^ _DAT_01febe20;
                      auVar48 = blendvps(_DAT_01feba00,*(undefined1 (*) [16])(args.ray + 0x80),
                                         auVar60);
                      *(undefined1 (*) [16])(args.ray + 0x80) = auVar48;
                      pRVar29 = args.ray;
                    }
                    auVar78._0_4_ = auVar77._0_4_ << 0x1f;
                    auVar78._4_4_ = auVar77._4_4_ << 0x1f;
                    auVar78._8_4_ = auVar77._8_4_ << 0x1f;
                    auVar78._12_4_ = auVar77._12_4_ << 0x1f;
                    iVar27 = movmskps((int)pRVar29,auVar78);
                    bVar45 = iVar27 == 0;
                    if (bVar45) {
                      *(undefined4 *)(ray + k * 4 + 0x80) = uVar40;
                      uVar43 = uVar43 ^ 1L << (uVar33 & 0x3f);
                    }
                  }
                  if (!bVar45) goto LAB_0028f68e;
                  uVar33 = local_aa0;
                  uVar41 = local_a98;
                  uVar42 = local_a90;
                } while (uVar43 != 0);
              }
            }
          }
          uVar28 = 0;
          uVar31 = uVar31 + 1;
          bVar44 = uVar31 < uVar30;
        } while (uVar31 != uVar30);
      }
    }
    goto LAB_0028f682;
  }
  goto LAB_0028f6c4;
LAB_0028f68e:
  uVar28 = 0;
  uVar33 = local_aa0;
  uVar41 = local_a98;
  uVar42 = local_a90;
  if (bVar44) {
    *(undefined4 *)(ray + k * 4 + 0x80) = 0xff800000;
    uVar28 = 1;
  }
LAB_0028f682:
  if ((uVar28 & 3) != 0) {
LAB_0028f6c4:
    return pNVar36 != stack;
  }
  goto LAB_0028e1e1;
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }